

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O2

int __thiscall
icu_63::TaiwanCalendar::clone
          (TaiwanCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TaiwanCalendar *this_00;
  
  this_00 = (TaiwanCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 != (TaiwanCalendar *)0x0) {
    TaiwanCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* TaiwanCalendar::clone(void) const
{
    return new TaiwanCalendar(*this);
}